

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab6-3.c
# Opt level: O1

int FeederBig3(void)

{
  int iVar1;
  uint uVar2;
  FILE *__stream;
  clock_t cVar3;
  clock_t cVar4;
  size_t sVar5;
  size_t sVar6;
  int i;
  int iVar7;
  long lVar8;
  char output [2001];
  int local_810;
  char local_808 [2008];
  
  __stream = fopen("in.txt","w+");
  printf("Creating Large test... ");
  cVar3 = clock();
  if (__stream == (FILE *)0x0) {
LAB_0010293c:
    puts("can\'t create in.txt. No space on disk?");
    iVar7 = -1;
  }
  else {
    fprintf(__stream,"%d\n",0xcb21);
    iVar7 = 0;
    do {
      memset(local_808,0,0x7d1);
      lVar8 = 0;
      do {
        local_808[lVar8] = (char)iVar7 + 'a';
        iVar1 = fprintf(__stream,"%s\n",local_808);
        if (iVar1 < 0) goto LAB_0010293c;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 2000);
      iVar7 = iVar7 + 1;
    } while (iVar7 != 0x1a);
    fwrite("abacaba\naba",0xb,1,__stream);
    cVar4 = clock();
    fclose(__stream);
    local_810 = (int)cVar3;
    testTimeOut = (int)cVar4 - local_810;
    uVar2 = RoundUptoThousand(testTimeOut);
    iVar7 = 0;
    printf("done in T=%ld seconds. Starting exe with timeout T+3 seconds... ",(ulong)uVar2 / 1000000
          );
    testTimeOut = testTimeOut + 3000000;
    sVar5 = GetLabPointerSize();
    sVar6 = GetLabPointerSize();
    LabMemoryLimit = (sVar5 + sVar6 * 2) * 0xcb21 + 0x5a2f28;
  }
  return iVar7;
}

Assistant:

static int FeederBig3(void) {
    FILE *const in = fopen("in.txt", "w+");
    printf("Creating Large test... ");
    clock_t start = clock();
    int n = MAX_WORD_LENGTH / 5 * ALPHABET_SIZE;
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }
    fprintf(in, "%d\n", n + 1);
    for (int i = 0; i < ALPHABET_SIZE; i++) {
        char output[MAX_WORD_LENGTH / 5 + 1] = "";
        for (int j = 0; j < MAX_WORD_LENGTH / 5; j++) {
            output[j] = 'a' + i;
            if (fprintf(in, "%s\n", output) < 0) {
                printf("can't create in.txt. No space on disk?\n");
                return -1;
            }
        }
    }
    fprintf(in, "abacaba\naba");
    clock_t end = clock();
    fclose(in);
    testTimeOut = end - start;
    printf("done in T=%ld seconds. Starting exe with timeout T+3 seconds... ", RoundUptoThousand(testTimeOut) / CLOCKS_PER_SEC);
    testTimeOut = testTimeOut + CLOCKS_PER_SEC * 3;
    size_t memoryForRecursion = n * (sizeof(void *) * 3);
    size_t memoryForTreeNodes = (n + 1) * (GetLabPointerSize() + sizeof(int) * 2 + 2 * GetLabPointerSize());
    size_t memoryForChars = n * sizeof(char);
    LabMemoryLimit = memoryForChars + memoryForTreeNodes + memoryForRecursion + MIN_PROCESS_RSS_BYTES;
    return 0;
}